

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_node * ly_ctx_get_node(ly_ctx *ctx,lys_node *start,char *nodeid,int output)

{
  lys_node *node;
  int output_local;
  char *nodeid_local;
  lys_node *start_local;
  ly_ctx *ctx_local;
  
  if ((((ctx == (ly_ctx *)0x0) && (start == (lys_node *)0x0)) || (nodeid == (char *)0x0)) ||
     ((*nodeid != '/' && (start == (lys_node *)0x0)))) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_ctx_get_node");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    start_local = (lys_node *)ctx;
    if (ctx == (ly_ctx *)0x0) {
      start_local = (lys_node *)start->module->ctx;
    }
    ctx_local = (ly_ctx *)resolve_json_nodeid(nodeid,(ly_ctx *)start_local,start,output);
  }
  return (lys_node *)ctx_local;
}

Assistant:

lys_node *
ly_ctx_get_node(const struct ly_ctx *ctx, const struct lys_node *start, const char *nodeid, int output)
{
    const struct lys_node *node;

    if ((!ctx && !start) || !nodeid || ((nodeid[0] != '/') && !start)) {
        LOGARG;
        return NULL;
    }

    if (!ctx) {
        ctx = start->module->ctx;
    }

    /* sets error and everything */
    node = resolve_json_nodeid(nodeid, ctx, start, output);

    return node;
}